

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,string *key,string *parent_key_information)

{
  SchnorrPubkey *this_00;
  bool bVar1;
  CfdException *this_01;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  ulong uVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  SchnorrPubkey schnorr;
  string hdkey_top;
  string errmsg;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this_00 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(this_00);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (key->_M_string_length < 4) {
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&errmsg,"DescriptorKeyInfo illegal key.",(allocator *)&hdkey_top);
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,&errmsg);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar2 = 1;
  ::std::__cxx11::string::substr((ulong)&hdkey_top,(ulong)key);
  bVar1 = ::std::operator==(&hdkey_top,"pub");
  if (!bVar1) {
    bVar1 = ::std::operator==(&hdkey_top,"prv");
    if (!bVar1) {
      this->key_type_ = kDescriptorKeyPublic;
      ByteData::ByteData((ByteData *)&list,key);
      bVar1 = Pubkey::IsValid((ByteData *)&list);
      if (bVar1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&list);
        Pubkey::Pubkey((Pubkey *)&errmsg,(ByteData *)&local_48);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,&errmsg);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
        this_02 = &local_48;
      }
      else {
        SchnorrPubkey::SchnorrPubkey(&schnorr,(ByteData *)&list);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr);
        SchnorrPubkey::GetHex_abi_cxx11_(&errmsg,this_00);
        ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&errmsg);
        ::std::__cxx11::string::~string((string *)&errmsg);
        this->key_type_ = kDescriptorKeySchnorr;
        this_02 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr;
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_02);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&list);
      goto LAB_0035d1db;
    }
  }
  ::std::__cxx11::string::string((string *)&errmsg,"/",(allocator *)&schnorr);
  StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&list,(string *)key,(string *)&errmsg);
  ::std::__cxx11::string::~string((string *)&errmsg);
  lVar3 = 0x20;
  for (; uVar2 < (ulong)((long)list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    ::std::operator+(&errmsg,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3
                     ));
    ::std::__cxx11::string::append((string *)&this->path_);
    ::std::__cxx11::string::~string((string *)&errmsg);
    lVar3 = lVar3 + 0x20;
  }
  bVar1 = ::std::operator==(&hdkey_top,"prv");
  if (bVar1) {
    this->key_type_ = kDescriptorKeyBip32Priv;
    ExtPrivkey::ExtPrivkey
              ((ExtPrivkey *)&errmsg,
               list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ExtPrivkey::operator=(&this->extprivkey_,(ExtPrivkey *)&errmsg);
    ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&errmsg);
  }
  else {
    this->key_type_ = kDescriptorKeyBip32;
    ExtPubkey::ExtPubkey
              ((ExtPubkey *)&errmsg,
               list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ExtPubkey::operator=(&this->extpubkey_,(ExtPubkey *)&errmsg);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
LAB_0035d1db:
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  ::std::__cxx11::string::~string((string *)&hdkey_top);
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const std::string& key, const std::string parent_key_information) {
  if (key.size() < 4) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "DescriptorKeyInfo illegal key.");
  }
  // analyze format
  std::string hdkey_top = key.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::vector<std::string> list = StringUtil::Split(key, "/");
    for (size_t index = 1; index < list.size(); ++index) {
      path_ += "/" + list[index];
    }
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
      extprivkey_ = ExtPrivkey(list[0]);
    } else {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
      extpubkey_ = ExtPubkey(list[0]);
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    try {
      // pubkey format check
      ByteData bytes(key);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey_ = Pubkey(bytes);
      } else {
        // schnorr pubkey
        SchnorrPubkey schnorr(bytes);
        schnorr_pubkey_ = schnorr;
        key_string_ = schnorr_pubkey_.GetHex();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (Privkey::HasWif(key)) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      Privkey privkey;
      // privkey WIF check
      try {
        privkey_ = Privkey::FromWif(key, NetType::kMainnet);
      } catch (const CfdException& except) {
        std::string errmsg(except.what());
        if (errmsg.find("Error WIF to Private key.") == std::string::npos) {
          throw except;
        }
      }
      if (!privkey_.IsValid()) {
        privkey_ = Privkey::FromWif(key, NetType::kTestnet);
      }
      key_string_ = privkey_.GetWif();
    }
  }

  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}